

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O2

wchar_t * nowide::basic_convert<wchar_t,char>
                    (wchar_t *buffer,size_t buffer_size,char *source_begin,char *source_end)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t *pwVar3;
  char *local_38;
  
  if (buffer_size == 0) {
    pwVar3 = (wchar_t *)0x0;
  }
  else {
    local_38 = source_begin;
    for (lVar2 = 0;
        ((pwVar3 = buffer, local_38 != source_end &&
         (wVar1 = utf::utf_traits<char,1>::decode<char_const*>(&local_38,source_end),
         pwVar3 = (wchar_t *)0x0, (uint)wVar1 < 0xfffffffe)) && (buffer_size - 1 != lVar2));
        lVar2 = lVar2 + 1) {
      buffer[lVar2] = wVar1;
    }
    buffer[lVar2] = L'\0';
  }
  return pwVar3;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace nowide::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }